

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getNormalization
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          )

{
  double *pdVar1;
  uint uVar2;
  size_t sVar3;
  pointer pdVar4;
  long lVar5;
  pointer pdVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  allocator_type local_11;
  
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             (long)(this->super_BaseCanonicalGrid).num_outputs,&local_11);
  lVar5 = (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (0 < lVar5) {
    sVar3 = (this->super_BaseCanonicalGrid).values.num_outputs;
    pdVar6 = (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar2 = (this->super_BaseCanonicalGrid).num_outputs;
    pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          dVar9 = ABS(pdVar6[uVar8]);
          pdVar1 = pdVar4 + uVar8;
          if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
            pdVar4[uVar8] = dVar9;
          }
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + sVar3;
    } while (lVar7 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridLocalPolynomial::getNormalization() const{
    std::vector<double> norms(num_outputs);
    for(int i=0; i<points.getNumIndexes(); i++){
        const double *v = values.getValues(i);
        for(int j=0; j<num_outputs; j++){
            if (norms[j] < std::abs(v[j])) norms[j] = std::abs(v[j]);
        }
    }
    return norms;
}